

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

int32 rw::xbox::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  long lVar1;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if ((*(long *)((long)object + 0x98) == 0) || (**(int **)((long)object + 0x98) != 5)) {
    object_local._4_4_ = 0;
  }
  else {
    lVar1 = *(long *)((long)object + 0x98);
    object_local._4_4_ =
         *(int *)(lVar1 + 4) + 0x10 + *(int *)(lVar1 + 0x14) * *(int *)(lVar1 + 0x10);
  }
  return object_local._4_4_;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_XBOX)
		return 0;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	return 12 + 4 + header->size + header->stride*header->numVertices;
}